

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall
TPZVec<TPZEqnArray<float>_>::Fill
          (TPZVec<TPZEqnArray<float>_> *this,TPZEqnArray<float> *copy,int64_t from,int64_t numelem)

{
  TPZEqnArray<float> *pTVar1;
  ostream *poVar2;
  long lVar3;
  long lVar5;
  long lVar4;
  
  if (numelem < -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"TPZVec::Fill",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"It\'s negative parameter numelem, then numelem = ",0x30);
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::ostream::flush();
  }
  lVar5 = 0;
  if (0 < from) {
    lVar5 = from;
  }
  lVar3 = this->fNElements;
  if (numelem < 0) {
    numelem = lVar3;
  }
  lVar4 = numelem + from;
  if (lVar3 <= numelem + from) {
    lVar4 = lVar3;
  }
  lVar3 = lVar4 - lVar5;
  if (lVar3 != 0 && lVar5 <= lVar4) {
    lVar5 = lVar5 * 0x22f0 + 0x1328;
    do {
      pTVar1 = this->fStore;
      *(undefined8 *)((long)pTVar1 + lVar5 + -0x1328) = *(undefined8 *)copy;
      TPZManVector<int,_100>::operator=
                ((TPZManVector<int,_100> *)((long)pTVar1 + lVar5 + -0x1320),
                 &(copy->fEqStart).super_TPZManVector<int,_100>);
      TPZManVector<int,_100>::operator=
                ((TPZManVector<int,_100> *)((long)pTVar1 + lVar5 + -0x1170),
                 &(copy->fEqNumber).super_TPZManVector<int,_100>);
      TPZManVector<float,_1000>::operator=
                ((TPZManVector<float,_1000> *)((long)pTVar1 + lVar5 + -0xfc0),
                 &(copy->fEqValues).super_TPZManVector<float,_1000>);
      TPZManVector<int,_1000>::operator=
                ((TPZManVector<int,_1000> *)
                 ((long)(pTVar1->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar5 + -0x28),
                 &(copy->fIndex).super_TPZManVector<int,_1000>);
      *(int *)((long)(pTVar1->fEqValues).super_TPZManVector<float,_1000>.fExtAlloc + lVar5 + 0xc38)
           = copy->fLastTerm;
      lVar5 = lVar5 + 0x22f0;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return;
}

Assistant:

void TPZVec<T>::Fill(const T& copy, const int64_t from, const int64_t numelem){
#ifndef PZNODEBUG
	if(numelem<0 && numelem != -1) {
		PZError << "TPZVec::Fill" << std::endl
		<< "It's negative parameter numelem, then numelem = "
		<< fNElements << std::endl;
		
		PZError.flush();
	}
#endif
	
	int64_t first = (from < 0) ? 0 : from;
	int64_t nel = numelem;
	first = (first > fNElements) ? fNElements : first;
	if (nel < 0) nel = fNElements;
	int64_t last = (from+nel > fNElements) ? fNElements : from+nel;
	
	for(int64_t i=first; i<last; i++)
		fStore[i] = copy;
}